

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O0

vector3_base<int> * allocator_default<vector3_base<int>_>::alloc_array(int size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  vector3_base<int> *pvVar4;
  int in_EDI;
  vector3_base<int> *local_38;
  
  uVar2 = (ulong)in_EDI;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0xc),0);
  if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = (vector3_base<int> *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_38 = pvVar4;
    do {
      vector3_base<int>::vector3_base(local_38);
      local_38 = local_38 + 1;
    } while (local_38 != pvVar4 + uVar2);
  }
  return pvVar4;
}

Assistant:

static T *alloc_array(int size) { return new T [size]; }